

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

void __thiscall sensors_analytics::DefaultConsumer::~DefaultConsumer(DefaultConsumer *this)

{
  pointer pcVar1;
  
  Close(this);
  pcVar1 = (this->data_file_path_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->data_file_path_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->records_);
  pcVar1 = (this->request_header_cookie)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->request_header_cookie).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

DefaultConsumer::~DefaultConsumer() {
  Close();
}